

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O1

result * baryonyx::optimize(result *__return_storage_ptr__,context_ptr *ctx,raw_problem *rawpb)

{
  mode_type mVar1;
  preprocessor_options pVar2;
  context *ctx_00;
  problem pStack_118;
  
  ctx_00 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  if (ctx_00 == (context *)0x0) {
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->duration = 0.0;
    __return_storage_ptr__->loop = 0;
    __return_storage_ptr__->variables = 0;
    __return_storage_ptr__->constraints = 0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->method)._M_len = 0;
    (__return_storage_ptr__->method)._M_str = (char *)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = empty_context;
  }
  else {
    mVar1 = (ctx_00->parameters).mode;
    if ((mVar1 & branch) == none) {
      if ((mVar1 & nlopt) == none) {
        pVar2 = (ctx_00->parameters).preprocessor;
        if ((mVar1 & manual) == none) {
          if (pVar2 == all) {
            preprocess(&pStack_118,ctx_00,rawpb);
            itm::optimize(__return_storage_ptr__,ctx_00,&pStack_118);
          }
          else {
            unpreprocess(&pStack_118,ctx_00,rawpb);
            itm::optimize(__return_storage_ptr__,ctx_00,&pStack_118);
          }
        }
        else if (pVar2 == all) {
          preprocess(&pStack_118,ctx_00,rawpb);
          itm::manual_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
        }
        else {
          unpreprocess(&pStack_118,ctx_00,rawpb);
          itm::manual_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
        }
      }
      else if ((ctx_00->parameters).preprocessor == all) {
        preprocess(&pStack_118,ctx_00,rawpb);
        itm::nlopt_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
      }
      else {
        unpreprocess(&pStack_118,ctx_00,rawpb);
        itm::nlopt_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
      }
    }
    else if ((ctx_00->parameters).preprocessor == all) {
      preprocess(&pStack_118,ctx_00,rawpb);
      itm::branch_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
    }
    else {
      unpreprocess(&pStack_118,ctx_00,rawpb);
      itm::branch_optimize(__return_storage_ptr__,ctx_00,&pStack_118);
    }
    problem::~problem(&pStack_118);
  }
  return __return_storage_ptr__;
}

Assistant:

result
optimize(const baryonyx::context_ptr& ctx, const raw_problem& rawpb)
{
    if (ctx) {
        if ((ctx->parameters.mode & solver_parameters::mode_type::branch) ==
            solver_parameters::mode_type::branch)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::branch_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::branch_optimize(*ctx, unpreprocess(*ctx, rawpb));

        if ((ctx->parameters.mode & solver_parameters::mode_type::nlopt) ==
            solver_parameters::mode_type::nlopt)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::nlopt_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::nlopt_optimize(*ctx, unpreprocess(*ctx, rawpb));

        if ((ctx->parameters.mode & solver_parameters::mode_type::manual) ==
            solver_parameters::mode_type::manual)
            return (ctx->parameters.preprocessor ==
                    solver_parameters::preprocessor_options::all)
                     ? itm::manual_optimize(*ctx, preprocess(*ctx, rawpb))
                     : itm::manual_optimize(*ctx, unpreprocess(*ctx, rawpb));

        return (ctx->parameters.preprocessor ==
                solver_parameters::preprocessor_options::all)
                 ? itm::optimize(*ctx, preprocess(*ctx, rawpb))
                 : itm::optimize(*ctx, unpreprocess(*ctx, rawpb));
    }

    return result{ baryonyx::result_status::empty_context };
}